

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef::~IfcArbitraryClosedProfileDef
          (IfcArbitraryClosedProfileDef *this)

{
  ~IfcArbitraryClosedProfileDef
            ((IfcArbitraryClosedProfileDef *)&this[-1].super_IfcProfileDef.ProfileName);
  return;
}

Assistant:

IfcArbitraryClosedProfileDef() : Object("IfcArbitraryClosedProfileDef") {}